

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int,false>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,int *expected,
          peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *actual)

{
  peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *ppVar1;
  string local_68;
  string local_48;
  
  if (*(int *)((long)&detail::peep_tag<test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>
                      ::value->m_ptr + *(long *)expected) == *(int *)actual_str) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    ppVar1 = detail::peep_tag<test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::value;
    FormatForComparisonFailureMessage<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int,false>>
              (&local_48,(internal *)actual_str,expected,
               detail::peep_tag<test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::value
              );
    FormatForComparisonFailureMessage<iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int,false>,int>
              (&local_68,(internal *)expected,
               (peep_member_object_impl<test::prod_test::ProdClass,_int,_false> *)actual_str,
               (int *)ppVar1);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }